

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall resetOnEndTimeFixture::~resetOnEndTimeFixture(resetOnEndTimeFixture *this)

{
  ~resetOnEndTimeFixture
            ((resetOnEndTimeFixture *)&this[-1].super_acceptorFixture.super_sessionFixture.factory);
  return;
}

Assistant:

void createSession() {
    now.setCurrent();
    startTimeStamp = now;
    startTimeStamp.setMillisecond(0);

    endTimeStamp = startTimeStamp;

    startTime = UtcTimeOnly(startTimeStamp);
    endTime = UtcTimeOnly(endTimeStamp);
    endTime += 2;

    acceptorFixture::createSession(0);
  }